

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

char * __thiscall
testing::internal::UntypedFunctionMockerBase::Name(UntypedFunctionMockerBase *this)

{
  char *pcVar1;
  MutexLock l;
  allocator local_39;
  GTestMutexLock local_38;
  string local_30;
  
  local_38.mutex_ = (MutexBase *)g_gmock_mutex;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  pcVar1 = this->name_;
  std::__cxx11::string::string
            ((string *)&local_30,
             "Name() must not be called before SetOwnerAndName() has been called.",&local_39);
  Assert(pcVar1 != (char *)0x0,
         "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock-gtest-all.cc"
         ,0x2a0f,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pcVar1 = this->name_;
  GTestMutexLock::~GTestMutexLock(&local_38);
  return pcVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  const char* name;
  {
    // We protect name_ under g_gmock_mutex in case this mock
    // function is called from two threads concurrently.
    MutexLock l(&g_gmock_mutex);
    Assert(name_ != NULL, __FILE__, __LINE__,
           "Name() must not be called before SetOwnerAndName() has "
           "been called.");
    name = name_;
  }
  return name;
}